

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void commit_v(uint8_t *digest,uint8_t *input,msgs_t *msgs,picnic_instance_t *params)

{
  size_t i;
  ulong uVar1;
  hash_context ctx;
  hash_context hStack_108;
  
  hash_init(&hStack_108,(ulong)params->digest_size);
  hash_update(&hStack_108,input,(ulong)params->input_output_size);
  for (uVar1 = 0; uVar1 < params->num_MPC_parties; uVar1 = uVar1 + 1) {
    hash_update(&hStack_108,msgs->msgs[uVar1],(ulong)((int)msgs->pos + 7U >> 3));
  }
  hash_final(&hStack_108);
  hash_squeeze(&hStack_108,digest,(ulong)params->digest_size);
  return;
}

Assistant:

static void commit_v(uint8_t* digest, const uint8_t* input, const msgs_t* msgs,
                     const picnic_instance_t* params) {
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  hash_update(&ctx, input, params->input_output_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update(&ctx, msgs->msgs[i], numBytes(msgs->pos));
  }
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}